

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

z_crc_t multmodp(z_crc_t a,z_crc_t b)

{
  uint local_1c;
  uint local_18;
  uint local_14;
  z_crc_t p;
  z_crc_t m;
  z_crc_t b_local;
  z_crc_t a_local;
  
  local_14 = 0x80000000;
  local_18 = 0;
  p = b;
  while (((a & local_14) == 0 || (local_18 = p ^ local_18, (a & local_14 - 1) != 0))) {
    local_14 = local_14 >> 1;
    if ((p & 1) == 0) {
      local_1c = p >> 1;
    }
    else {
      local_1c = p >> 1 ^ 0xedb88320;
    }
    p = local_1c;
  }
  return local_18;
}

Assistant:

local z_crc_t multmodp(z_crc_t a, z_crc_t b) {
    z_crc_t m, p;

    m = (z_crc_t)1 << 31;
    p = 0;
    for (;;) {
        if (a & m) {
            p ^= b;
            if ((a & (m - 1)) == 0)
                break;
        }
        m >>= 1;
        b = b & 1 ? (b >> 1) ^ POLY : b >> 1;
    }
    return p;
}